

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::~raw_quasi_adaptive_huffman_data_model
          (raw_quasi_adaptive_huffman_data_model *this)

{
  vector<unsigned_short> *in_RDI;
  
  if (in_RDI[3].m_p != (unsigned_short *)0x0) {
    lzham_delete<lzham::prefix_coding::decoder_tables>((decoder_tables *)0x136548);
  }
  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_RDI);
  vector<unsigned_short>::~vector(in_RDI);
  vector<unsigned_short>::~vector(in_RDI);
  return;
}

Assistant:

raw_quasi_adaptive_huffman_data_model::~raw_quasi_adaptive_huffman_data_model()
   {
      if (m_pDecode_tables)
         lzham_delete(m_pDecode_tables);
   }